

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O0

void __thiscall
Net::Net(Net *this,int input_size,int output_size,int hidden_layers_amount,
        vector<int,_std::allocator<int>_> *hidden_layers,int _function_type)

{
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  reference pvVar7;
  result_type_conflict rVar8;
  int local_148c;
  int local_1488;
  int x_1;
  int j_1;
  vector<double,_std::allocator<double>_> local_1478;
  allocator<double> local_1459;
  vector<double,_std::allocator<double>_> local_1458;
  int local_143c;
  int local_1438;
  int x;
  int j;
  allocator<double> local_1411;
  value_type_conflict2 local_1410;
  vector<double,_std::allocator<double>_> local_1408;
  int local_13ec;
  undefined1 auStack_13e8 [4];
  int i;
  double local_13e0;
  undefined1 local_13d8 [8];
  uniform_real_distribution<double> dist;
  mt19937 rnd;
  int _function_type_local;
  vector<int,_std::allocator<int>_> *hidden_layers_local;
  int hidden_layers_amount_local;
  int output_size_local;
  int input_size_local;
  Net *this_local;
  
  this->function_type = SIGMOID;
  this->MOD = 100.0;
  Table::Table(&this->samples);
  Table::Table(&this->answers);
  std::vector<int,_std::allocator<int>_>::vector(&this->shuffler);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->mesh);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->meshZ);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->biases);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->init_biases);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->weights);
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::vector(&this->init);
  this->function_type = _function_type;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist._M_param._M_b,0x4b);
  if (input_size < 2) {
    std::operator<<((ostream *)&std::cerr,"Minimum input size is 2\n");
    exit(1);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->mesh,(long)(hidden_layers_amount + 2));
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->init,(long)(hidden_layers_amount + 2));
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(&this->weights,(long)(hidden_layers_amount + 2));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->init_biases,(long)(hidden_layers_amount + 2));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&this->biases,(long)(hidden_layers_amount + 2));
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,0);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)input_size);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::back(&this->mesh);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)output_size);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_13d8,0.0,1.0);
  if (this->function_type == TANH) {
    std::uniform_real_distribution<double>::uniform_real_distribution
              ((uniform_real_distribution<double> *)auStack_13e8,-1.0,1.0);
    local_13d8 = (undefined1  [8])_auStack_13e8;
    dist._M_param._M_a = local_13e0;
  }
  local_13ec = 1;
  while( true ) {
    iVar1 = local_13ec;
    sVar3 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&this->mesh);
    if ((int)sVar3 + -1 <= iVar1) break;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)local_13ec);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (hidden_layers,(long)(local_13ec + -1));
    std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)*pvVar4);
    pvVar5 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->init,(long)local_13ec);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (hidden_layers,(long)(local_13ec + -1));
    iVar1 = *pvVar4;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)(local_13ec + -1));
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    local_1410 = 0.0;
    std::allocator<double>::allocator(&local_1411);
    std::vector<double,_std::allocator<double>_>::vector(&local_1408,sVar3,&local_1410,&local_1411);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::assign(pvVar5,(long)iVar1,&local_1408);
    std::vector<double,_std::allocator<double>_>::~vector(&local_1408);
    std::allocator<double>::~allocator(&local_1411);
    pvVar5 = std::
             vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ::operator[](&this->weights,(long)local_13ec);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (hidden_layers,(long)(local_13ec + -1));
    iVar1 = *pvVar4;
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->mesh,(long)(local_13ec + -1));
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    std::allocator<double>::allocator((allocator<double> *)((long)&x + 3));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&j,sVar3,
               (allocator<double> *)((long)&x + 3));
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar5,(long)iVar1,(value_type *)&j);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&j);
    std::allocator<double>::~allocator((allocator<double> *)((long)&x + 3));
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->biases,(long)local_13ec);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (hidden_layers,(long)(local_13ec + -1));
    std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)*pvVar4);
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&this->init_biases,(long)local_13ec);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (hidden_layers,(long)(local_13ec + -1));
    std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)*pvVar4);
    local_1438 = 0;
    while( true ) {
      uVar6 = (ulong)local_1438;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,(long)local_13ec);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if (sVar3 <= uVar6) break;
      rVar8 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)local_13d8,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&dist._M_param._M_b);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->biases,(long)local_13ec);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_1438);
      *pvVar7 = rVar8;
      local_143c = 0;
      while( true ) {
        iVar1 = local_143c;
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&this->mesh,(long)(local_13ec + -1));
        sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
        if ((int)sVar3 <= iVar1) break;
        rVar8 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)local_13d8,
                           (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&dist._M_param._M_b);
        pvVar5 = std::
                 vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ::operator[](&this->weights,(long)local_13ec);
        pvVar2 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](pvVar5,(long)local_1438);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_143c);
        *pvVar7 = rVar8;
        local_143c = local_143c + 1;
      }
      local_1438 = local_1438 + 1;
    }
    local_13ec = local_13ec + 1;
  }
  pvVar5 = std::
           vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ::back(&this->weights);
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->mesh);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,sVar3 - 2);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
  std::allocator<double>::allocator(&local_1459);
  std::vector<double,_std::allocator<double>_>::vector(&local_1458,sVar3,&local_1459);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(pvVar5,(long)output_size,&local_1458);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1458);
  std::allocator<double>::~allocator(&local_1459);
  pvVar5 = std::
           vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ::back(&this->init);
  sVar3 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::size(&this->mesh);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](&this->mesh,sVar3 - 2);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
  _j_1 = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&x_1 + 3));
  std::vector<double,_std::allocator<double>_>::vector
            (&local_1478,sVar3,(value_type_conflict2 *)&j_1,(allocator<double> *)((long)&x_1 + 3));
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::assign(pvVar5,(long)output_size,&local_1478);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1478);
  std::allocator<double>::~allocator((allocator<double> *)((long)&x_1 + 3));
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::back(&this->biases);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)output_size);
  pvVar2 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::back(&this->init_biases);
  std::vector<double,_std::allocator<double>_>::resize(pvVar2,(long)output_size);
  local_1488 = 0;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(&this->mesh);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
    if (sVar3 <= (ulong)(long)local_1488) break;
    rVar8 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_13d8,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist._M_param._M_b);
    pvVar2 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::back(&this->biases);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_1488);
    *pvVar7 = rVar8;
    local_148c = 0;
    while( true ) {
      sVar3 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&this->mesh);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->mesh,sVar3 - 2);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(pvVar2);
      if ((int)sVar3 <= local_148c) break;
      rVar8 = std::uniform_real_distribution<double>::operator()
                        ((uniform_real_distribution<double> *)local_13d8,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&dist._M_param._M_b);
      pvVar5 = std::
               vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               ::back(&this->weights);
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](pvVar5,(long)local_1488);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(long)local_148c);
      *pvVar7 = rVar8;
      local_148c = local_148c + 1;
    }
    local_1488 = local_1488 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->meshZ,&this->mesh);
  return;
}

Assistant:

Net::Net(int input_size, int output_size, int hidden_layers_amount, const std::vector<int>& hidden_layers, int _function_type) {
    function_type = (FUNCTIONS)_function_type;
    std::mt19937 rnd(75);
    if (input_size < 2){
        std::cerr << "Minimum input size is 2\n";
        exit(EXIT_FAILURE);
    }
    mesh.resize(2 + hidden_layers_amount);
    init.resize(2 + hidden_layers_amount);
    weights.resize(2 + hidden_layers_amount);
    init_biases.resize(2 + hidden_layers_amount);
    biases.resize(2 + hidden_layers_amount);
    mesh[0].resize(input_size);
    mesh.back().resize(output_size);

    auto dist = std::uniform_real_distribution<double>(0.0, 1.0);
    if (function_type == TANH)
        dist = std::uniform_real_distribution<double>(-1.0, 1.0);
    for (int i = 1; i < (int)mesh.size()-1; ++i){
        mesh[i].resize(hidden_layers[i - 1]);
        init[i].assign(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size(), 0));
        weights[i].resize(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size()));
        biases[i].resize(hidden_layers[i - 1]);
        init_biases[i].resize(hidden_layers[i - 1]);
        for (int j = 0; j < mesh[i].size(); ++j) {
            biases[i][j] = dist(rnd);
            for (int x = 0; x < (int) mesh[i - 1].size(); ++x)
                weights[i][j][x] = dist(rnd);
        }
    }
    weights.back().resize(output_size, std::vector<double>(mesh[mesh.size()-2].size()));
    init.back().assign(output_size, std::vector<double>(mesh[mesh.size()-2].size(), 0));
    biases.back().resize(output_size);
    init_biases.back().resize(output_size);
    for (int j = 0; j < mesh.back().size(); ++j) {
        biases.back()[j] = dist(rnd);
        for (int x = 0; x < (int) mesh[mesh.size() - 2].size(); ++x)
            weights.back()[j][x] = dist(rnd);
    }
    meshZ = mesh;
}